

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_257,_false,_embree::avx2::VirtualCurveIntersectorK<4>,_true>::
     occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  vfloat<4> vVar1;
  byte bVar2;
  BVH *bvh;
  void *pvVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 uVar13;
  undefined8 uVar14;
  vbool<4> vVar15;
  char cVar16;
  bool bVar17;
  uint uVar18;
  undefined4 uVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  NodeRef root;
  size_t sVar24;
  size_t sVar25;
  ulong uVar26;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar27;
  NodeRef *pNVar28;
  undefined1 in_ZMM0 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar58;
  float fVar64;
  float fVar65;
  float fVar66;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  vfloat4 a0;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar87 [64];
  vbool<4> terminated;
  vbool<4> valid_o;
  TravRayK<4,_false> tray;
  Precalculations pre;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  undefined1 auVar84 [64];
  undefined1 auVar86 [64];
  
  uVar14 = mm_lookupmask_ps._8_8_;
  uVar13 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  sVar25 = (bvh->root).ptr;
  if (sVar25 != 8) {
    auVar31 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar49 = vpcmpeqd_avx(auVar31,(undefined1  [16])valid_i->field_0);
    auVar31 = *(undefined1 (*) [16])(ray + 0x80);
    auVar29 = ZEXT816(0) << 0x40;
    auVar34 = vcmpps_avx(auVar31,auVar29,5);
    auVar34 = vandps_avx(auVar34,auVar49);
    uVar21 = vmovmskps_avx(auVar34);
    if (uVar21 != 0) {
      uVar22 = (ulong)(uVar21 & 0xff);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar49._0_4_ = tray.dir.field_0._32_4_ * tray.dir.field_0._32_4_;
      auVar49._4_4_ = tray.dir.field_0._36_4_ * tray.dir.field_0._36_4_;
      auVar49._8_4_ = tray.dir.field_0._40_4_ * tray.dir.field_0._40_4_;
      auVar49._12_4_ = tray.dir.field_0._44_4_ * tray.dir.field_0._44_4_;
      auVar49 = vfmadd231ps_fma(auVar49,(undefined1  [16])tray.dir.field_0.field_0.y.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar51 = vfmadd231ps_fma(auVar49,(undefined1  [16])tray.dir.field_0.field_0.x.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar49 = vrsqrtps_avx(auVar51);
      fVar58 = auVar49._0_4_;
      fVar64 = auVar49._4_4_;
      fVar65 = auVar49._8_4_;
      fVar66 = auVar49._12_4_;
      auVar50._0_4_ = fVar58 * fVar58 * fVar58 * auVar51._0_4_ * -0.5;
      auVar50._4_4_ = fVar64 * fVar64 * fVar64 * auVar51._4_4_ * -0.5;
      auVar50._8_4_ = fVar65 * fVar65 * fVar65 * auVar51._8_4_ * -0.5;
      auVar50._12_4_ = fVar66 * fVar66 * fVar66 * auVar51._12_4_ * -0.5;
      auVar67._8_4_ = 0x3fc00000;
      auVar67._0_8_ = 0x3fc000003fc00000;
      auVar67._12_4_ = 0x3fc00000;
      pre.depth_scale.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vfmadd213ps_fma(auVar67,auVar49,auVar50);
      auVar51._8_4_ = 0x80000000;
      auVar51._0_8_ = 0x8000000080000000;
      auVar51._12_4_ = 0x80000000;
      do {
        lVar23 = 0;
        for (uVar26 = uVar22; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
          lVar23 = lVar23 + 1;
        }
        uVar26 = (ulong)(uint)((int)lVar23 * 4);
        auVar49 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar26 + 0x40)),
                                ZEXT416(*(uint *)(ray + uVar26 + 0x50)),0x1c);
        auVar49 = vinsertps_avx(auVar49,ZEXT416(*(uint *)(ray + uVar26 + 0x60)),0x28);
        fVar58 = *(float *)((long)pre.ray_space + (uVar26 - 0x10));
        auVar73._0_4_ = auVar49._0_4_ * fVar58;
        auVar73._4_4_ = auVar49._4_4_ * fVar58;
        auVar73._8_4_ = auVar49._8_4_ * fVar58;
        auVar73._12_4_ = auVar49._12_4_ * fVar58;
        auVar50 = vshufpd_avx(auVar73,auVar73,1);
        auVar49 = vmovshdup_avx(auVar73);
        auVar78._0_4_ = auVar49._0_4_ ^ 0x80000000;
        auVar49 = vunpckhps_avx(auVar73,auVar29);
        auVar78._4_12_ = ZEXT812(0) << 0x20;
        auVar76._0_8_ = auVar50._0_8_ ^ 0x8000000080000000;
        auVar76._8_8_ = auVar50._8_8_ ^ auVar51._8_8_;
        auVar67 = vinsertps_avx(auVar76,auVar73,0x2a);
        auVar70 = vshufps_avx(auVar49,auVar78,0x41);
        auVar49 = vdpps_avx(auVar67,auVar67,0x7f);
        auVar50 = vdpps_avx(auVar70,auVar70,0x7f);
        auVar49 = vcmpps_avx(auVar49,auVar50,1);
        auVar81._0_4_ = auVar49._0_4_;
        auVar81._4_4_ = auVar81._0_4_;
        auVar81._8_4_ = auVar81._0_4_;
        auVar81._12_4_ = auVar81._0_4_;
        auVar49 = vblendvps_avx(auVar67,auVar70,auVar81);
        auVar50 = vdpps_avx(auVar49,auVar49,0x7f);
        auVar67 = vrsqrtss_avx(auVar50,auVar50);
        fVar64 = auVar67._0_4_;
        fVar64 = fVar64 * 1.5 - auVar50._0_4_ * 0.5 * fVar64 * fVar64 * fVar64;
        auVar77._0_4_ = auVar49._0_4_ * fVar64;
        auVar77._4_4_ = auVar49._4_4_ * fVar64;
        auVar77._8_4_ = auVar49._8_4_ * fVar64;
        auVar77._12_4_ = auVar49._12_4_ * fVar64;
        auVar49 = vshufps_avx(auVar77,auVar77,0xc9);
        auVar50 = vshufps_avx(auVar73,auVar73,0xc9);
        auVar82._0_4_ = auVar77._0_4_ * auVar50._0_4_;
        auVar82._4_4_ = auVar77._4_4_ * auVar50._4_4_;
        auVar82._8_4_ = auVar77._8_4_ * auVar50._8_4_;
        auVar82._12_4_ = auVar77._12_4_ * auVar50._12_4_;
        auVar49 = vfmsub231ps_fma(auVar82,auVar73,auVar49);
        auVar67 = vshufps_avx(auVar49,auVar49,0xc9);
        auVar49 = vdpps_avx(auVar67,auVar67,0x7f);
        auVar50 = vrsqrtss_avx(auVar49,auVar49);
        fVar64 = auVar50._0_4_;
        fVar64 = fVar64 * 1.5 - auVar49._0_4_ * 0.5 * fVar64 * fVar64 * fVar64;
        uVar22 = uVar22 - 1 & uVar22;
        auVar79._0_4_ = fVar64 * auVar67._0_4_;
        auVar79._4_4_ = fVar64 * auVar67._4_4_;
        auVar79._8_4_ = fVar64 * auVar67._8_4_;
        auVar79._12_4_ = fVar64 * auVar67._12_4_;
        auVar70._0_4_ = fVar58 * auVar73._0_4_;
        auVar70._4_4_ = fVar58 * auVar73._4_4_;
        auVar70._8_4_ = fVar58 * auVar73._8_4_;
        auVar70._12_4_ = fVar58 * auVar73._12_4_;
        auVar67 = vunpcklps_avx(auVar77,auVar70);
        auVar49 = vunpckhps_avx(auVar77,auVar70);
        auVar70 = vunpcklps_avx(auVar79,auVar29);
        auVar50 = vunpckhps_avx(auVar79,auVar29);
        aVar5 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar49,auVar50);
        aVar6 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar67,auVar70);
        aVar4 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar67,auVar70);
        pre.ray_space[lVar23].vx.field_0 = aVar6;
        pre.ray_space[lVar23].vy.field_0 = aVar4;
        pre.ray_space[lVar23].vz.field_0 = aVar5;
      } while (uVar22 != 0);
      tray.org.field_0._0_4_ = *(undefined4 *)ray;
      tray.org.field_0._4_4_ = *(undefined4 *)(ray + 4);
      tray.org.field_0._8_4_ = *(undefined4 *)(ray + 8);
      tray.org.field_0._12_4_ = *(undefined4 *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(undefined4 *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(undefined4 *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(undefined4 *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(undefined4 *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(undefined4 *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(undefined4 *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(undefined4 *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(undefined4 *)(ray + 0x2c);
      auVar80._8_4_ = 0x7fffffff;
      auVar80._0_8_ = 0x7fffffff7fffffff;
      auVar80._12_4_ = 0x7fffffff;
      auVar49 = vandps_avx(auVar80,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar83._8_4_ = 0x219392ef;
      auVar83._0_8_ = 0x219392ef219392ef;
      auVar83._12_4_ = 0x219392ef;
      auVar84 = ZEXT1664(auVar83);
      auVar49 = vcmpps_avx(auVar49,auVar83,1);
      auVar29 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar83,auVar49);
      auVar49 = vandps_avx(auVar80,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar49 = vcmpps_avx(auVar49,auVar83,1);
      auVar51 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar83,auVar49);
      auVar49 = vandps_avx(auVar80,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar49 = vcmpps_avx(auVar49,auVar83,1);
      auVar49 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar83,auVar49);
      auVar50 = vrcpps_avx(auVar29);
      auVar85._8_4_ = 0x3f800000;
      auVar85._0_8_ = 0x3f8000003f800000;
      auVar85._12_4_ = 0x3f800000;
      auVar86 = ZEXT1664(auVar85);
      auVar29 = vfnmadd213ps_fma(auVar29,auVar50,auVar85);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar29,auVar50,auVar50)
      ;
      auVar29 = vrcpps_avx(auVar51);
      auVar51 = vfnmadd213ps_fma(auVar51,auVar29,auVar85);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar51,auVar29,auVar29)
      ;
      auVar29 = vrcpps_avx(auVar49);
      auVar49 = vfnmadd213ps_fma(auVar49,auVar29,auVar85);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar49,auVar29,auVar29)
      ;
      tray.org_rdir.field_0._0_4_ = (float)tray.org.field_0._0_4_ * tray.rdir.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = (float)tray.org.field_0._4_4_ * tray.rdir.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = (float)tray.org.field_0._8_4_ * tray.rdir.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = (float)tray.org.field_0._12_4_ * tray.rdir.field_0._12_4_;
      tray.org_rdir.field_0._16_4_ = (float)tray.org.field_0._16_4_ * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = (float)tray.org.field_0._20_4_ * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = (float)tray.org.field_0._24_4_ * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = (float)tray.org.field_0._28_4_ * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = (float)tray.org.field_0._32_4_ * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = (float)tray.org.field_0._36_4_ * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = (float)tray.org.field_0._40_4_ * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = (float)tray.org.field_0._44_4_ * tray.rdir.field_0._44_4_;
      auVar29 = ZEXT416(0) << 0x20;
      auVar49 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar29,1);
      auVar52._8_4_ = 0x20;
      auVar52._0_8_ = 0x2000000020;
      auVar52._12_4_ = 0x20;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar49,auVar52);
      auVar49 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar29,5);
      auVar53._8_4_ = 0x40;
      auVar53._0_8_ = 0x4000000040;
      auVar53._12_4_ = 0x40;
      auVar59._8_4_ = 0x60;
      auVar59._0_8_ = 0x6000000060;
      auVar59._12_4_ = 0x60;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar59,auVar53,auVar49);
      auVar49 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar29,5);
      auVar36._8_4_ = 0x80;
      auVar36._0_8_ = 0x8000000080;
      auVar36._12_4_ = 0x80;
      auVar41._8_4_ = 0xa0;
      auVar41._0_8_ = 0xa0000000a0;
      auVar41._12_4_ = 0xa0;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar41,auVar36,auVar49);
      auVar49 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar29);
      auVar31 = vmaxps_avx(auVar31,auVar29);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar87 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar49,auVar34);
      auVar29._8_4_ = 0xff800000;
      auVar29._0_8_ = 0xff800000ff800000;
      auVar29._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar29,auVar31,auVar34);
      auVar31 = vpcmpeqd_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])tray.tfar.field_0
                            );
      terminated.field_0.i[1] = auVar34._4_4_ ^ auVar31._4_4_;
      terminated.field_0.i[0] = auVar34._0_4_ ^ auVar31._0_4_;
      terminated.field_0.i[2] = auVar34._8_4_ ^ auVar31._8_4_;
      terminated.field_0.i[3] = auVar34._12_4_ ^ auVar31._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar21 = 3;
      }
      else {
        uVar21 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar28 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar27 = &stack_near[2].field_0;
      stack_node[1].ptr = sVar25;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
LAB_005b22d0:
      do {
        do {
          root.ptr = pNVar28[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_005b2837;
          pNVar28 = pNVar28 + -1;
          paVar27 = paVar27 + -1;
          vVar1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar27->v;
          auVar35 = ZEXT1664((undefined1  [16])vVar1.field_0);
          auVar31 = vcmpps_avx((undefined1  [16])vVar1.field_0,(undefined1  [16])tray.tfar.field_0,1
                              );
          uVar18 = vmovmskps_avx(auVar31);
        } while (uVar18 == 0);
        uVar22 = (ulong)(uVar18 & 0xff);
        uVar18 = POPCOUNT(uVar18 & 0xff);
        if (uVar21 < uVar18) {
LAB_005b230e:
          do {
            vVar15.field_0 = terminated.field_0;
            iVar20 = 4;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_005b2837;
              auVar31 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar35._0_16_,6);
              if ((((auVar31 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar31 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar31 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar31[0xf] < '\0') {
                bVar2 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                pvVar3 = This->leafIntersector;
                valid_o.field_0._8_8_ = uVar14;
                valid_o.field_0._0_8_ = uVar13;
                uVar18 = vmovmskps_avx((undefined1  [16])terminated.field_0);
                if ((uVar18 ^ 0xf) != 0) {
                  uVar22 = (ulong)((uVar18 ^ 0xf) & 0xff);
                  do {
                    lVar23 = 0;
                    for (uVar26 = uVar22; (uVar26 & 1) == 0;
                        uVar26 = uVar26 >> 1 | 0x8000000000000000) {
                      lVar23 = lVar23 + 1;
                    }
                    cVar16 = (**(code **)((long)pvVar3 + (ulong)bVar2 * 0x40 + 0x18))
                                       (&pre,ray,lVar23,context,
                                        (byte *)(root.ptr & 0xfffffffffffffff0));
                    if (cVar16 != '\0') {
                      valid_o.field_0.i[lVar23] = -1;
                    }
                    uVar22 = uVar22 - 1 & uVar22;
                  } while (uVar22 != 0);
                  auVar84 = ZEXT1664(CONCAT412(0x219392ef,CONCAT48(0x219392ef,0x219392ef219392ef)));
                  auVar86 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
                  auVar87 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                }
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     vorps_avx((undefined1  [16])valid_o.field_0,(undefined1  [16])vVar15.field_0);
                auVar31 = _DAT_01f7ae20 & ~(undefined1  [16])terminated.field_0;
                if ((((auVar31 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar31 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar31 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar31[0xf]) goto LAB_005b2837;
                auVar40._8_4_ = 0xff800000;
                auVar40._0_8_ = 0xff800000ff800000;
                auVar40._12_4_ = 0xff800000;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar40,
                                   (undefined1  [16])terminated.field_0);
              }
              goto LAB_005b22d0;
            }
            uVar22 = root.ptr & 0xfffffffffffffff0;
            lVar23 = 0x38;
            sVar25 = 8;
            auVar31 = auVar87._0_16_;
            do {
              sVar24 = *(size_t *)((uVar22 - 0x1c0) + lVar23 * 8);
              if (sVar24 == 8) {
                auVar35 = ZEXT1664(auVar31);
                sVar24 = sVar25;
                break;
              }
              if ((root.ptr & 7) == 0) {
                uVar19 = *(undefined4 *)((root.ptr - 0xa0) + lVar23 * 4);
                auVar42._4_4_ = uVar19;
                auVar42._0_4_ = uVar19;
                auVar42._8_4_ = uVar19;
                auVar42._12_4_ = uVar19;
                auVar10._4_4_ = tray.org_rdir.field_0._4_4_;
                auVar10._0_4_ = tray.org_rdir.field_0._0_4_;
                auVar10._8_4_ = tray.org_rdir.field_0._8_4_;
                auVar10._12_4_ = tray.org_rdir.field_0._12_4_;
                auVar44 = vfmsub213ps_fma(auVar42,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.x.field_0,auVar10);
                uVar19 = *(undefined4 *)((root.ptr - 0x60) + lVar23 * 4);
                auVar37._4_4_ = uVar19;
                auVar37._0_4_ = uVar19;
                auVar37._8_4_ = uVar19;
                auVar37._12_4_ = uVar19;
                auVar11._4_4_ = tray.org_rdir.field_0._20_4_;
                auVar11._0_4_ = tray.org_rdir.field_0._16_4_;
                auVar11._8_4_ = tray.org_rdir.field_0._24_4_;
                auVar11._12_4_ = tray.org_rdir.field_0._28_4_;
                auVar39 = vfmsub213ps_fma(auVar37,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.y.field_0,auVar11);
                uVar19 = *(undefined4 *)((root.ptr - 0x20) + lVar23 * 4);
                auVar30._4_4_ = uVar19;
                auVar30._0_4_ = uVar19;
                auVar30._8_4_ = uVar19;
                auVar30._12_4_ = uVar19;
                auVar12._4_4_ = tray.org_rdir.field_0._36_4_;
                auVar12._0_4_ = tray.org_rdir.field_0._32_4_;
                auVar12._8_4_ = tray.org_rdir.field_0._40_4_;
                auVar12._12_4_ = tray.org_rdir.field_0._44_4_;
                auVar33 = vfmsub213ps_fma(auVar30,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.z.field_0,auVar12);
                uVar19 = *(undefined4 *)((root.ptr - 0x80) + lVar23 * 4);
                auVar45._4_4_ = uVar19;
                auVar45._0_4_ = uVar19;
                auVar45._8_4_ = uVar19;
                auVar45._12_4_ = uVar19;
                auVar48 = vfmsub213ps_fma(auVar45,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.x.field_0,auVar10);
                uVar19 = *(undefined4 *)((root.ptr - 0x40) + lVar23 * 4);
                auVar54._4_4_ = uVar19;
                auVar54._0_4_ = uVar19;
                auVar54._8_4_ = uVar19;
                auVar54._12_4_ = uVar19;
                auVar57 = vfmsub213ps_fma(auVar54,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.y.field_0,auVar11);
                uVar19 = *(undefined4 *)(root.ptr + lVar23 * 4);
                auVar60._4_4_ = uVar19;
                auVar60._0_4_ = uVar19;
                auVar60._8_4_ = uVar19;
                auVar60._12_4_ = uVar19;
                auVar63 = vfmsub213ps_fma(auVar60,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.z.field_0,auVar12);
              }
              else {
                uVar19 = *(undefined4 *)((uVar22 - 0x40) + lVar23 * 4);
                auVar61._4_4_ = uVar19;
                auVar61._0_4_ = uVar19;
                auVar61._8_4_ = uVar19;
                auVar61._12_4_ = uVar19;
                uVar19 = *(undefined4 *)((uVar22 - 0x20) + lVar23 * 4);
                auVar55._4_4_ = uVar19;
                auVar55._0_4_ = uVar19;
                auVar55._8_4_ = uVar19;
                auVar55._12_4_ = uVar19;
                uVar19 = *(undefined4 *)(uVar22 + lVar23 * 4);
                auVar46._4_4_ = uVar19;
                auVar46._0_4_ = uVar19;
                auVar46._8_4_ = uVar19;
                auVar46._12_4_ = uVar19;
                fVar58 = *(float *)(uVar22 + 0x20 + lVar23 * 4);
                auVar68._4_4_ = fVar58;
                auVar68._0_4_ = fVar58;
                auVar68._8_4_ = fVar58;
                auVar68._12_4_ = fVar58;
                fVar64 = *(float *)(uVar22 + 0x40 + lVar23 * 4);
                auVar71._4_4_ = fVar64;
                auVar71._0_4_ = fVar64;
                auVar71._8_4_ = fVar64;
                auVar71._12_4_ = fVar64;
                fVar65 = *(float *)(uVar22 + 0x60 + lVar23 * 4);
                auVar74._4_4_ = fVar65;
                auVar74._0_4_ = fVar65;
                auVar74._8_4_ = fVar65;
                auVar74._12_4_ = fVar65;
                uVar19 = *(undefined4 *)(uVar22 + 0x80 + lVar23 * 4);
                auVar43._4_4_ = uVar19;
                auVar43._0_4_ = uVar19;
                auVar43._8_4_ = uVar19;
                auVar43._12_4_ = uVar19;
                uVar19 = *(undefined4 *)(uVar22 + 0xa0 + lVar23 * 4);
                auVar38._4_4_ = uVar19;
                auVar38._0_4_ = uVar19;
                auVar38._8_4_ = uVar19;
                auVar38._12_4_ = uVar19;
                uVar19 = *(undefined4 *)(uVar22 + 0xc0 + lVar23 * 4);
                auVar32._4_4_ = uVar19;
                auVar32._0_4_ = uVar19;
                auVar32._8_4_ = uVar19;
                auVar32._12_4_ = uVar19;
                auVar9._4_4_ = tray.org.field_0._36_4_;
                auVar9._0_4_ = tray.org.field_0._32_4_;
                auVar9._8_4_ = tray.org.field_0._40_4_;
                auVar9._12_4_ = tray.org.field_0._44_4_;
                auVar49 = vfmadd231ps_fma(auVar43,auVar9,auVar68);
                auVar29 = vfmadd231ps_fma(auVar38,auVar9,auVar71);
                auVar51 = vfmadd231ps_fma(auVar32,auVar9,auVar74);
                auVar69._0_4_ = (float)tray.dir.field_0._32_4_ * fVar58;
                auVar69._4_4_ = (float)tray.dir.field_0._36_4_ * fVar58;
                auVar69._8_4_ = (float)tray.dir.field_0._40_4_ * fVar58;
                auVar69._12_4_ = (float)tray.dir.field_0._44_4_ * fVar58;
                auVar72._0_4_ = fVar64 * (float)tray.dir.field_0._32_4_;
                auVar72._4_4_ = fVar64 * (float)tray.dir.field_0._36_4_;
                auVar72._8_4_ = fVar64 * (float)tray.dir.field_0._40_4_;
                auVar72._12_4_ = fVar64 * (float)tray.dir.field_0._44_4_;
                auVar75._0_4_ = fVar65 * (float)tray.dir.field_0._32_4_;
                auVar75._4_4_ = fVar65 * (float)tray.dir.field_0._36_4_;
                auVar75._8_4_ = fVar65 * (float)tray.dir.field_0._40_4_;
                auVar75._12_4_ = fVar65 * (float)tray.dir.field_0._44_4_;
                auVar50 = vfmadd231ps_fma(auVar69,(undefined1  [16])
                                                  tray.dir.field_0.field_0.y.field_0,auVar61);
                auVar67 = vfmadd231ps_fma(auVar72,(undefined1  [16])
                                                  tray.dir.field_0.field_0.y.field_0,auVar55);
                auVar70 = vfmadd231ps_fma(auVar75,auVar46,
                                          (undefined1  [16])tray.dir.field_0.field_0.y.field_0);
                auVar8._4_4_ = tray.org.field_0._20_4_;
                auVar8._0_4_ = tray.org.field_0._16_4_;
                auVar8._8_4_ = tray.org.field_0._24_4_;
                auVar8._12_4_ = tray.org.field_0._28_4_;
                auVar73 = vfmadd231ps_fma(auVar49,auVar8,auVar61);
                uVar19 = *(undefined4 *)((uVar22 - 0xa0) + lVar23 * 4);
                auVar62._4_4_ = uVar19;
                auVar62._0_4_ = uVar19;
                auVar62._8_4_ = uVar19;
                auVar62._12_4_ = uVar19;
                auVar76 = vfmadd231ps_fma(auVar29,auVar8,auVar55);
                uVar19 = *(undefined4 *)((uVar22 - 0x80) + lVar23 * 4);
                auVar56._4_4_ = uVar19;
                auVar56._0_4_ = uVar19;
                auVar56._8_4_ = uVar19;
                auVar56._12_4_ = uVar19;
                auVar77 = vfmadd231ps_fma(auVar51,auVar8,auVar46);
                uVar19 = *(undefined4 *)((uVar22 - 0x60) + lVar23 * 4);
                auVar47._4_4_ = uVar19;
                auVar47._0_4_ = uVar19;
                auVar47._8_4_ = uVar19;
                auVar47._12_4_ = uVar19;
                auVar29 = vfmadd231ps_fma(auVar50,(undefined1  [16])
                                                  tray.dir.field_0.field_0.x.field_0,auVar62);
                auVar51 = vfmadd231ps_fma(auVar67,(undefined1  [16])
                                                  tray.dir.field_0.field_0.x.field_0,auVar56);
                auVar50 = vfmadd231ps_fma(auVar70,auVar47,
                                          (undefined1  [16])tray.dir.field_0.field_0.x.field_0);
                auVar49 = vandps_avx(auVar80,auVar29);
                auVar67 = auVar84._0_16_;
                auVar49 = vcmpps_avx(auVar49,auVar67,1);
                auVar29 = vblendvps_avx(auVar29,auVar67,auVar49);
                auVar49 = vandps_avx(auVar51,auVar80);
                auVar49 = vcmpps_avx(auVar49,auVar67,1);
                auVar51 = vblendvps_avx(auVar51,auVar67,auVar49);
                auVar49 = vandps_avx(auVar50,auVar80);
                auVar49 = vcmpps_avx(auVar49,auVar67,1);
                auVar49 = vblendvps_avx(auVar50,auVar67,auVar49);
                auVar50 = vrcpps_avx(auVar29);
                auVar67 = auVar86._0_16_;
                auVar29 = vfnmadd213ps_fma(auVar29,auVar50,auVar67);
                auVar50 = vfmadd132ps_fma(auVar29,auVar50,auVar50);
                auVar29 = vrcpps_avx(auVar51);
                auVar51 = vfnmadd213ps_fma(auVar51,auVar29,auVar67);
                auVar51 = vfmadd132ps_fma(auVar51,auVar29,auVar29);
                auVar29 = vrcpps_avx(auVar49);
                auVar49 = vfnmadd213ps_fma(auVar49,auVar29,auVar67);
                auVar49 = vfmadd132ps_fma(auVar49,auVar29,auVar29);
                auVar7._4_4_ = tray.org.field_0._4_4_;
                auVar7._0_4_ = tray.org.field_0._0_4_;
                auVar7._8_4_ = tray.org.field_0._8_4_;
                auVar7._12_4_ = tray.org.field_0._12_4_;
                auVar29 = vfmadd231ps_fma(auVar73,auVar7,auVar62);
                auVar67 = vfmadd231ps_fma(auVar76,auVar7,auVar56);
                auVar70 = vfmadd231ps_fma(auVar77,auVar7,auVar47);
                auVar44._0_4_ = auVar29._0_4_ * -auVar50._0_4_;
                auVar44._4_4_ = auVar29._4_4_ * -auVar50._4_4_;
                auVar44._8_4_ = auVar29._8_4_ * -auVar50._8_4_;
                auVar44._12_4_ = auVar29._12_4_ * -auVar50._12_4_;
                auVar39._0_4_ = auVar67._0_4_ * -auVar51._0_4_;
                auVar39._4_4_ = auVar67._4_4_ * -auVar51._4_4_;
                auVar39._8_4_ = auVar67._8_4_ * -auVar51._8_4_;
                auVar39._12_4_ = auVar67._12_4_ * -auVar51._12_4_;
                auVar33._0_4_ = auVar70._0_4_ * -auVar49._0_4_;
                auVar33._4_4_ = auVar70._4_4_ * -auVar49._4_4_;
                auVar33._8_4_ = auVar70._8_4_ * -auVar49._8_4_;
                auVar33._12_4_ = auVar70._12_4_ * -auVar49._12_4_;
                auVar48._0_4_ = auVar50._0_4_ + auVar44._0_4_;
                auVar48._4_4_ = auVar50._4_4_ + auVar44._4_4_;
                auVar48._8_4_ = auVar50._8_4_ + auVar44._8_4_;
                auVar48._12_4_ = auVar50._12_4_ + auVar44._12_4_;
                auVar57._0_4_ = auVar51._0_4_ + auVar39._0_4_;
                auVar57._4_4_ = auVar51._4_4_ + auVar39._4_4_;
                auVar57._8_4_ = auVar51._8_4_ + auVar39._8_4_;
                auVar57._12_4_ = auVar51._12_4_ + auVar39._12_4_;
                auVar63._0_4_ = auVar49._0_4_ + auVar33._0_4_;
                auVar63._4_4_ = auVar49._4_4_ + auVar33._4_4_;
                auVar63._8_4_ = auVar49._8_4_ + auVar33._8_4_;
                auVar63._12_4_ = auVar49._12_4_ + auVar33._12_4_;
              }
              auVar49 = vpminsd_avx(auVar44,auVar48);
              auVar29 = vpminsd_avx(auVar39,auVar57);
              auVar49 = vpmaxsd_avx(auVar49,auVar29);
              auVar29 = vpminsd_avx(auVar33,auVar63);
              auVar29 = vpmaxsd_avx(auVar49,auVar29);
              auVar49 = vpmaxsd_avx(auVar44,auVar48);
              auVar51 = vpmaxsd_avx(auVar39,auVar57);
              auVar51 = vpminsd_avx(auVar49,auVar51);
              auVar49 = vpmaxsd_avx(auVar33,auVar63);
              auVar51 = vpminsd_avx(auVar51,auVar49);
              auVar49 = vpmaxsd_avx(auVar29,(undefined1  [16])tray.tnear.field_0);
              auVar51 = vpminsd_avx(auVar51,(undefined1  [16])tray.tfar.field_0);
              auVar49 = vcmpps_avx(auVar49,auVar51,2);
              if ((((auVar49 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar49 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar49 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar49[0xf]) {
                auVar35 = ZEXT1664(auVar31);
                sVar24 = sVar25;
              }
              else {
                auVar49 = vblendvps_avx(auVar87._0_16_,auVar29,auVar49);
                auVar35 = ZEXT1664(auVar49);
                if (sVar25 != 8) {
                  pNVar28->ptr = sVar25;
                  pNVar28 = pNVar28 + 1;
                  *(undefined1 (*) [16])paVar27->v = auVar31;
                  paVar27 = paVar27 + 1;
                }
              }
              lVar23 = lVar23 + 1;
              auVar31 = auVar35._0_16_;
              sVar25 = sVar24;
            } while (lVar23 != 0x40);
            if (sVar24 == 8) goto LAB_005b261c;
            auVar31 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                 (undefined1  [16])auVar35._0_16_,6);
            uVar19 = vmovmskps_avx(auVar31);
            root.ptr = sVar24;
          } while ((byte)uVar21 < (byte)POPCOUNT(uVar19));
          pNVar28->ptr = sVar24;
          pNVar28 = pNVar28 + 1;
          *paVar27 = auVar35._0_16_;
          paVar27 = paVar27 + 1;
        }
        else {
          do {
            sVar25 = 0;
            for (uVar26 = uVar22; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
              sVar25 = sVar25 + 1;
            }
            bVar17 = occluded1(This,bvh,root,sVar25,&pre,ray,&tray,context);
            if (bVar17) {
              terminated.field_0.i[sVar25] = -1;
            }
            uVar22 = uVar22 - 1 & uVar22;
          } while (uVar22 != 0);
          auVar31 = _DAT_01f7ae20 & ~(undefined1  [16])terminated.field_0;
          iVar20 = 3;
          if ((((auVar31 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar31 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar31 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar31[0xf] < '\0') {
            auVar31._8_4_ = 0xff800000;
            auVar31._0_8_ = 0xff800000ff800000;
            auVar31._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar31,
                               (undefined1  [16])terminated.field_0);
            iVar20 = 2;
          }
          auVar84 = ZEXT1664(CONCAT412(0x219392ef,CONCAT48(0x219392ef,0x219392ef219392ef)));
          auVar86 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
          auVar87 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar35 = ZEXT1664((undefined1  [16])vVar1.field_0);
          if (uVar21 < uVar18) goto LAB_005b230e;
        }
LAB_005b261c:
      } while (iVar20 != 3);
LAB_005b2837:
      auVar31 = vandps_avx(auVar34,(undefined1  [16])terminated.field_0);
      auVar34._8_4_ = 0xff800000;
      auVar34._0_8_ = 0xff800000ff800000;
      auVar34._12_4_ = 0xff800000;
      auVar31 = vmaskmovps_avx(auVar31,auVar34);
      *(undefined1 (*) [16])(ray + 0x80) = auVar31;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }